

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00352ef0 == '\x01') {
    DAT_00352ef0 = '\0';
    (*(code *)*_LinkedModel_default_instance_)();
  }
  if (DAT_00352f28 == '\x01') {
    DAT_00352f28 = 0;
    (*(code *)*_LinkedModelFile_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinkedModel_default_instance_.Shutdown();
  _LinkedModelFile_default_instance_.Shutdown();
}